

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errno.cc
# Opt level: O0

int bio_errno_should_retry(int return_value)

{
  int *piVar1;
  undefined1 local_11;
  undefined4 local_c;
  int return_value_local;
  
  if (return_value == -1) {
    piVar1 = __errno_location();
    local_11 = 1;
    if (*piVar1 != 0xb) {
      piVar1 = __errno_location();
      local_11 = 1;
      if (*piVar1 != 0x6b) {
        piVar1 = __errno_location();
        local_11 = 1;
        if (*piVar1 != 4) {
          piVar1 = __errno_location();
          local_11 = 1;
          if (*piVar1 != 0xb) {
            piVar1 = __errno_location();
            local_11 = 1;
            if (*piVar1 != 0x47) {
              piVar1 = __errno_location();
              local_11 = 1;
              if (*piVar1 != 0x73) {
                piVar1 = __errno_location();
                local_11 = 1;
                if (*piVar1 != 0x72) {
                  local_11 = 0;
                }
              }
            }
          }
        }
      }
    }
    local_c = (uint)local_11;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int bio_errno_should_retry(int return_value) {
  if (return_value != -1) {
    return 0;
  }

  return
#ifdef EWOULDBLOCK
      errno == EWOULDBLOCK ||
#endif
#ifdef ENOTCONN
      errno == ENOTCONN ||
#endif
#ifdef EINTR
      errno == EINTR ||
#endif
#ifdef EAGAIN
      errno == EAGAIN ||
#endif
#ifdef EPROTO
      errno == EPROTO ||
#endif
#ifdef EINPROGRESS
      errno == EINPROGRESS ||
#endif
#ifdef EALREADY
      errno == EALREADY ||
#endif
      0;
}